

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

idx_t __thiscall
duckdb::JoinHashTable::GetTotalSize
          (JoinHashTable *this,
          vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_true>
          *param_1,idx_t *max_partition_size,idx_t *max_partition_count)

{
  pointer puVar1;
  pointer pJVar2;
  type this_00;
  idx_t iVar3;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> *ht;
  size_type __n;
  pointer this_01;
  allocator_type local_71;
  idx_t *local_70;
  value_type_conflict1 local_68;
  vector<unsigned_long,_true> partition_counts;
  vector<unsigned_long,_true> partition_sizes;
  
  __n = 1L << ((byte)this->radix_bits & 0x3f);
  partition_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_70 = max_partition_count;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_sizes,__n,
             (value_type_conflict1 *)&partition_counts,(allocator_type *)&local_68);
  local_68 = 0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_counts,__n,
             &local_68,&local_71);
  puVar1 = (param_1->
           super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (param_1->
                 super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1; this_01 = this_01 + 1
      ) {
    pJVar2 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator->(this_01);
    this_00 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
              ::operator*(&pJVar2->sink_collection);
    PartitionedTupleData::GetSizesAndCounts(this_00,&partition_sizes,&partition_counts);
  }
  iVar3 = GetTotalSize(this,&partition_sizes,&partition_counts,max_partition_size,local_70);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_counts);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_sizes);
  return iVar3;
}

Assistant:

idx_t JoinHashTable::GetTotalSize(const vector<unique_ptr<JoinHashTable>> &local_hts, idx_t &max_partition_size,
                                  idx_t &max_partition_count) const {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	vector<idx_t> partition_sizes(num_partitions, 0);
	vector<idx_t> partition_counts(num_partitions, 0);
	for (auto &ht : local_hts) {
		ht->GetSinkCollection().GetSizesAndCounts(partition_sizes, partition_counts);
	}

	return GetTotalSize(partition_sizes, partition_counts, max_partition_size, max_partition_count);
}